

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void lds_GvM(PDISASM pMyDisasm)

{
  int iVar1;
  Int32 IVar2;
  PDISASM pMyDisasm_local;
  
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
    if (((pMyDisasm->Reserved_).Architecture == 0x40) ||
       (((pMyDisasm->Reserved_).Architecture == 0x20 && ((pMyDisasm->Reserved_).MOD_ == 3)))) {
      iVar1 = Security(3,pMyDisasm);
      if (iVar1 != 0) {
        if ((pMyDisasm->Reserved_).REX.state == '\x01') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Prefix).OperandSize == '\x01') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Prefix).RepPrefix == '\x02') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Prefix).RepnePrefix == '\x02') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        (pMyDisasm->Reserved_).REX.R_ =
             ((byte)((int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 7) ^ 0xff) & 1;
        (pMyDisasm->Reserved_).VEX.vvvv =
             (byte)((int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3) & 0xf;
        (pMyDisasm->Reserved_).VEX.L =
             (byte)((int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 2) & 1;
        (pMyDisasm->Reserved_).VEX.pp = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) & 3;
        (pMyDisasm->Reserved_).VEX.mmmmm = '\x01';
        (pMyDisasm->Reserved_).REX.state = '\x01';
        (pMyDisasm->Reserved_).VEX.state = '\x01';
        (pMyDisasm->Reserved_).VEX.opcode = 0xc5;
        if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
          (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
          (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
          (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
          (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
          (*opcode_map2[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
        }
        else if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
          (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
          (pMyDisasm->Prefix).OperandSize = '\x01';
          (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
          (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
          (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
          (pMyDisasm->Reserved_).OriginalOperandSize = (pMyDisasm->Reserved_).OperandSize;
          if ((pMyDisasm->Reserved_).Architecture == 0x10) {
            (pMyDisasm->Reserved_).OperandSize = 0x20;
          }
          else if ((pMyDisasm->Reserved_).OperandSize != 0x40) {
            (pMyDisasm->Reserved_).OperandSize = 0x10;
          }
          (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
          (*opcode_map2[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
          IVar2 = 0x20;
          if ((pMyDisasm->Reserved_).Architecture == 0x10) {
            IVar2 = 0x10;
          }
          (pMyDisasm->Reserved_).OperandSize = IVar2;
        }
        else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
          (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
          (pMyDisasm->Prefix).RepPrefix = '\x02';
          (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
          (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
          (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
          (pMyDisasm->Reserved_).PrefRepe = 1;
          (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
          (*opcode_map2[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
          (pMyDisasm->Reserved_).PrefRepe = 0;
        }
        else if ((pMyDisasm->Reserved_).VEX.pp == '\x03') {
          (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
          (pMyDisasm->Prefix).RepnePrefix = '\x02';
          (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
          (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
          (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
          (pMyDisasm->Reserved_).PrefRepne = 1;
          (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
          (*opcode_map2[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
          (pMyDisasm->Reserved_).PrefRepne = 0;
        }
      }
    }
    else {
      (pMyDisasm->Instruction).Category = 0x1000b;
      strcpy((pMyDisasm->Instruction).Mnemonic,"lds");
      if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
        (pMyDisasm->Reserved_).MemDecoration = 0x6b;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).EIP_ =
             (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).EIP_ =
             (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      }
    }
  }
  return;
}

Assistant:

void __bea_callspec__ lds_GvM(PDISASM pMyDisasm)
{
    /* if MOD == 11b, invalid instruction */

    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;

    if (
        (GV.Architecture == 64) ||
        ((GV.Architecture == 32) && (GV.MOD_ == 0x3))
      ) {

        /* VEX2Bytes prefix */

        if (!Security(3, pMyDisasm)) return;
        if (GV.REX.state == InUsePrefix) {
          GV.ERROR_OPCODE = UD_;
        }
        if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
          GV.ERROR_OPCODE = UD_;
        }
        if (pMyDisasm->Prefix.RepPrefix == SuperfluousPrefix) {
          GV.ERROR_OPCODE = UD_;
        }
        if (pMyDisasm->Prefix.RepnePrefix == SuperfluousPrefix) {
          GV.ERROR_OPCODE = UD_;
        }
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
          GV.ERROR_OPCODE = UD_;
        }
        GV.REX.R_ = ~((*((UInt8*) (GV.EIP_+1))) >> 7) & 0x1;
        GV.VEX.vvvv = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0xF;
        GV.VEX.L = ((*((UInt8*) (GV.EIP_+1))) >> 2) & 0x1;
        GV.VEX.pp = ((*((UInt8*) (GV.EIP_+1)))) & 0x3;
        GV.VEX.mmmmm = 0x1; /* Force OFh */

        GV.REX.state = InUsePrefix;
        GV.VEX.state = InUsePrefix;
        GV.VEX.opcode = 0xc5;

        if (GV.VEX.pp == 0x0) {
            GV.NB_PREFIX++;
            pMyDisasm->Prefix.Number++;
            GV.EIP_+=2;
            pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
            (void) opcode_map2[*((UInt8*) GV.EIP_)](pMyDisasm);
        }
        else if (GV.VEX.pp == 0x1) {
            /* 66h */
            GV.EIP_+=1;
            pMyDisasm->Prefix.OperandSize = InUsePrefix;
            GV.EIP_++;
            pMyDisasm->Prefix.Number++;
            GV.NB_PREFIX++;
            GV.OriginalOperandSize = GV.OperandSize;  /* if GV.OperandSize is used as a mandatory prefix, keep the real operandsize value */
            if (GV.Architecture == 16) {
              GV.OperandSize = 32;
            }
            else {
              if (GV.OperandSize != 64) {
                GV.OperandSize = 16;
              }
            }
            pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
            (void) opcode_map2[*((UInt8*) GV.EIP_)](pMyDisasm);
            GV.OperandSize = (GV.Architecture == 16) ? 16 : 32;
        }
        else if (GV.VEX.pp == 0x2) {
            /* F3h */
            GV.EIP_+=1;
            pMyDisasm->Prefix.RepPrefix = SuperfluousPrefix;
            GV.EIP_++;
            pMyDisasm->Prefix.Number++;
            GV.NB_PREFIX++;
            GV.PrefRepe = 1;
            pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
            (void) opcode_map2[*((UInt8*) GV.EIP_)](pMyDisasm);
            GV.PrefRepe = 0;
        }
        else if (GV.VEX.pp == 0x3) {
            /* F2h */
            GV.EIP_+=1;
            pMyDisasm->Prefix.RepnePrefix = SuperfluousPrefix;
            GV.EIP_++;
            pMyDisasm->Prefix.Number++;
            GV.NB_PREFIX++;
            GV.PrefRepne = 1;
            pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
            (void) opcode_map2[*((UInt8*) GV.EIP_)](pMyDisasm);
            GV.PrefRepne = 0;
        }
    }
    else {
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+SEGMENT_REGISTER;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "lds");
        #endif
        if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2fword;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_+= GV.DECALAGE_EIP+2;
        }
        else {
            GV.MemDecoration = Arg2dword;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_+= GV.DECALAGE_EIP+2;
        }
    }
}